

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

void __thiscall
flow_cutter::BasicCutter::
grow_assimilated_sets<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch>
          (BasicCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,PseudoDepthFirstSearch *search_algo)

{
  BasicCutter *pBVar1;
  anon_class_1_0_00000001 on_new_arc;
  anon_class_1_0_00000001 on_new_node;
  anon_class_8_1_8991fb9c has_flow;
  anon_class_8_1_b4f2a08e should_follow_arc;
  anon_class_8_1_8991fb9c local_68;
  anon_class_16_2_f7da023b is_backward_saturated;
  anon_class_16_2_f7da023b is_forward_saturated;
  anon_class_16_2_0c89a5ce see_node;
  anon_class_24_3_80b2dc0f local_30;
  
  has_flow.this = this;
  is_backward_saturated.this = this;
  is_backward_saturated.graph = graph;
  is_forward_saturated.this = this;
  is_forward_saturated.graph = graph;
  if (this->reachable[1].node_set.node_count_inside_ <
      this->reachable[0].node_set.node_count_inside_) {
    should_follow_arc.is_backward_saturated = &is_backward_saturated;
    local_30.has_flow = &has_flow;
    pBVar1 = (BasicCutter *)(this->assimilated + 1);
    local_30.on_new_arc = &on_new_arc;
    see_node.on_new_node = &on_new_node;
    local_68.this = (BasicNodeSet *)pBVar1;
    see_node.this = (BasicNodeSet *)pBVar1;
    local_30.this = (AssimilatedNodeSet *)pBVar1;
    PseudoDepthFirstSearch::operator()
              (search_algo,graph,tmp,this->assimilated[1].node_set.extra_node,&local_68,&see_node,
               &should_follow_arc,&local_30);
    this->assimilated[1].node_set.extra_node = -1;
    this = pBVar1;
  }
  else {
    should_follow_arc.is_backward_saturated = &is_forward_saturated;
    local_30.has_flow = &has_flow;
    local_30.on_new_arc = &on_new_arc;
    see_node.on_new_node = &on_new_node;
    local_68.this = (BasicNodeSet *)this;
    see_node.this = (BasicNodeSet *)this;
    local_30.this = this->assimilated;
    PseudoDepthFirstSearch::operator()
              (search_algo,graph,tmp,this->assimilated[0].node_set.extra_node,
               (anon_class_8_1_8991fb9c *)&local_68,(anon_class_16_2_0c89a5ce *)&see_node,
               (anon_class_8_1_7e1b71c4 *)&should_follow_arc,(anon_class_24_3_80b2dc0f *)&local_30);
    this->assimilated[0].node_set.extra_node = -1;
  }
  AssimilatedNodeSet::
  shrink_cut_front<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
            (this->assimilated,graph);
  return;
}

Assistant:

void grow_assimilated_sets(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo)
    {
        auto is_forward_saturated = [&, this](int xy) {
            return this->is_saturated(graph, source_side, xy);
        };

        auto is_backward_saturated = [&, this](int xy) {
            return this->is_saturated(graph, target_side, xy);
        };

        if (reachable[source_side].node_count_inside() <= reachable[target_side].node_count_inside()) {
            auto on_new_node = [&](int x) { return true; };
            auto should_follow_arc = [&](int xy) {
                return !is_forward_saturated(xy);
            };
            auto on_new_arc = [](int xy) {};
            auto has_flow = [&](int xy) { return flow(xy) != 0; };
            assimilated[source_side].grow(graph, tmp, search_algo, on_new_node,
                should_follow_arc, on_new_arc, has_flow);
            assimilated[source_side].shrink_cut_front(graph);
        } else {
            auto on_new_node = [&](int x) { return true; };
            auto should_follow_arc = [&](int xy) {
                return !is_backward_saturated(xy);
            };
            auto on_new_arc = [](int xy) {};
            auto has_flow = [&](int xy) { return flow(xy) != 0; };
            assimilated[target_side].grow(graph, tmp, search_algo, on_new_node,
                should_follow_arc, on_new_arc, has_flow);
            assimilated[target_side].shrink_cut_front(graph);
        }
    }